

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Bool cff_blend_check_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  int iVar1;
  FT_Fixed *NDV_local;
  FT_UInt lenNDV_local;
  FT_UInt vsindex_local;
  CFF_Blend blend_local;
  
  if (((blend->builtBV == '\0') || (blend->lastVsindex != vsindex)) || (blend->lenNDV != lenNDV)) {
LAB_002edd0c:
    blend_local._7_1_ = '\x01';
  }
  else {
    if (lenNDV != 0) {
      iVar1 = memcmp(NDV,blend->lastNDV,(ulong)lenNDV << 3);
      if (iVar1 != 0) goto LAB_002edd0c;
    }
    blend_local._7_1_ = '\0';
  }
  return blend_local._7_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  cff_blend_check_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    if ( !blend->builtBV                                ||
         blend->lastVsindex != vsindex                  ||
         blend->lenNDV != lenNDV                        ||
         ( lenNDV                                     &&
           ft_memcmp( NDV,
                      blend->lastNDV,
                      lenNDV * sizeof ( *NDV ) ) != 0 ) )
    {
      /* need to build blend vector */
      return TRUE;
    }

    return FALSE;
  }